

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inCharCode(Tokenizer *this,char ch)

{
  bool bVar1;
  int iVar2;
  bool handled;
  char ch_local;
  Tokenizer *this_local;
  
  bVar1 = false;
  if (('/' < ch) && (ch < '8')) {
    this->char_code = this->char_code * 8 + ch + -0x30;
    iVar2 = this->digit_count + 1;
    this->digit_count = iVar2;
    if (iVar2 < 3) {
      return;
    }
    bVar1 = true;
  }
  std::__cxx11::string::operator+=((string *)&this->val,(char)(this->char_code % 0x100));
  this->state = st_in_string;
  if (!bVar1) {
    inString(this,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inCharCode(char ch)
{
    bool handled = false;
    if (('0' <= ch) && (ch <= '7')) {
        char_code = 8 * char_code + (int(ch) - int('0'));
        if (++(digit_count) < 3) {
            return;
        }
        handled = true;
    }
    // We've accumulated \ddd or we have \d or \dd followed by other than an octal digit. The PDF
    // Spec says to ignore high-order overflow.
    val += char(char_code % 256);
    state = st_in_string;
    if (!handled) {
        inString(ch);
    }
}